

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O0

Slot * __thiscall
wasm::ModuleSplitting::anon_unknown_0::TableSlotManager::getSlot
          (Slot *__return_storage_ptr__,TableSlotManager *this,Name func,HeapType type)

{
  Index IVar1;
  Slot slot;
  Name func_00;
  Name func_01;
  bool bVar2;
  pointer ppVar3;
  Table *pTVar4;
  iterator __first;
  iterator __last;
  ElementSegment *pEVar5;
  size_type sVar6;
  address64_t aVar7;
  pointer pDVar8;
  char *pcVar9;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  size_t local_b0;
  char *local_a8;
  uintptr_t local_a0;
  uintptr_t local_98;
  char *local_90;
  RefFunc *local_88;
  Builder local_80;
  Builder builder;
  Slot local_60;
  _Self local_38;
  _Self local_30;
  iterator slotIt;
  TableSlotManager *this_local;
  HeapType type_local;
  Name func_local;
  
  pcVar9 = func.super_IString.str._M_str;
  type_local.id = func.super_IString.str._M_len;
  slotIt._M_node = (_Base_ptr)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>_>_>
       ::find(&this->funcIndices,(key_type *)&type_local);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>_>_>
       ::end(&this->funcIndices);
  bVar2 = std::operator!=(&local_30,&local_38);
  if (bVar2) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>_>
             ::operator->(&local_30);
    memcpy(__return_storage_ptr__,&ppVar3->second,0x28);
  }
  else {
    if (this->activeSegment == (ElementSegment *)0x0) {
      if (this->activeTable == (Table *)0x0) {
        pTVar4 = makeTable(this);
        this->activeTable = pTVar4;
        local_60.tableName.super_IString.str._M_len =
             (this->activeTable->super_Importable).super_Named.name.super_IString.str._M_len;
        local_60.tableName.super_IString.str._M_str =
             (this->activeTable->super_Importable).super_Named.name.super_IString.str._M_str;
        wasm::Name::Name(&local_60.global,"");
        local_60.index = 0;
        Slot::operator=(&this->activeBase,&local_60);
      }
      __first = std::
                vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ::begin(&this->module->elementSegments);
      __last = std::
               vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
               ::end(&this->module->elementSegments);
      builder.wasm = (Module *)this;
      bVar2 = std::
              all_of<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>*,std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>>,wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::getSlot(wasm::Name,wasm::HeapType)::__0>
                        ((__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                          )__first._M_current,
                         (__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                          )__last._M_current,(anon_class_8_1_8991fb9c)this);
      if (!bVar2) {
        __assert_fail("std::all_of(module.elementSegments.begin(), module.elementSegments.end(), [&](std::unique_ptr<ElementSegment>& segment) { return segment->table != activeTable->name; })"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-splitting.cpp"
                      ,0xe7,
                      "TableSlotManager::Slot wasm::ModuleSplitting::(anonymous namespace)::TableSlotManager::getSlot(Name, HeapType)"
                     );
      }
      pEVar5 = makeElementSegment(this);
      this->activeSegment = pEVar5;
    }
    (__return_storage_ptr__->tableName).super_IString.str._M_len =
         (this->activeBase).tableName.super_IString.str._M_len;
    (__return_storage_ptr__->tableName).super_IString.str._M_str =
         (this->activeBase).tableName.super_IString.str._M_str;
    (__return_storage_ptr__->global).super_IString.str._M_len =
         (this->activeBase).global.super_IString.str._M_len;
    (__return_storage_ptr__->global).super_IString.str._M_str =
         (this->activeBase).global.super_IString.str._M_str;
    IVar1 = (this->activeBase).index;
    sVar6 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                      (&this->activeSegment->data);
    __return_storage_ptr__->index = IVar1 + (int)sVar6;
    Builder::Builder(&local_80,this->module);
    pEVar5 = this->activeSegment;
    local_98 = type_local.id;
    func_01.super_IString.str._M_str = pcVar9;
    func_01.super_IString.str._M_len = type_local.id;
    local_a0 = type.id;
    local_90 = pcVar9;
    local_88 = Builder::makeRefFunc(&local_80,func_01,type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (&pEVar5->data,(value_type *)&local_88);
    local_b0 = type_local.id;
    local_a8 = pcVar9;
    memcpy(&local_d8,__return_storage_ptr__,0x28);
    func_00.super_IString.str._M_str = local_a8;
    func_00.super_IString.str._M_len = local_b0;
    slot.tableName.super_IString.str._M_str = (char *)uStack_d0;
    slot.tableName.super_IString.str._M_len = local_d8;
    slot.global.super_IString.str._M_len = local_c8;
    slot.global.super_IString.str._M_str = (char *)uStack_c0;
    slot._32_8_ = local_b8;
    addSlot(this,func_00,slot);
    aVar7 = wasm::Address::operator_cast_to_unsigned_long(&this->activeTable->initial);
    if (aVar7 <= __return_storage_ptr__->index) {
      wasm::Address::operator=
                (&this->activeTable->initial,(ulong)(__return_storage_ptr__->index + 1));
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->module->dylinkSection);
      if (bVar2) {
        aVar7 = wasm::Address::operator_cast_to_unsigned_long(&this->activeTable->initial);
        pDVar8 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
                 operator->(&this->module->dylinkSection);
        pDVar8->tableSize = (Index)aVar7;
      }
    }
    aVar7 = wasm::Address::operator_cast_to_unsigned_long(&this->activeTable->max);
    if (aVar7 <= __return_storage_ptr__->index) {
      wasm::Address::operator=(&this->activeTable->max,(ulong)(__return_storage_ptr__->index + 1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TableSlotManager::Slot TableSlotManager::getSlot(Name func, HeapType type) {
  auto slotIt = funcIndices.find(func);
  if (slotIt != funcIndices.end()) {
    return slotIt->second;
  }

  // If there are no segments yet, allocate one.
  if (activeSegment == nullptr) {
    if (activeTable == nullptr) {
      activeTable = makeTable();
      activeBase = {activeTable->name, "", 0};
    }

    // None of the existing segments should refer to the active table
    assert(std::all_of(module.elementSegments.begin(),
                       module.elementSegments.end(),
                       [&](std::unique_ptr<ElementSegment>& segment) {
                         return segment->table != activeTable->name;
                       }));

    activeSegment = makeElementSegment();
  }

  Slot newSlot = {activeBase.tableName,
                  activeBase.global,
                  activeBase.index + Index(activeSegment->data.size())};

  Builder builder(module);
  activeSegment->data.push_back(builder.makeRefFunc(func, type));

  addSlot(func, newSlot);
  if (activeTable->initial <= newSlot.index) {
    activeTable->initial = newSlot.index + 1;
    // TODO: handle the active table not being the dylink table (#3823)
    if (module.dylinkSection) {
      module.dylinkSection->tableSize = activeTable->initial;
    }
  }
  if (activeTable->max <= newSlot.index) {
    activeTable->max = newSlot.index + 1;
  }
  return newSlot;
}